

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_view_2d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,size_t nb1,size_t offset)

{
  ggml_tensor *pgVar1;
  int64_t ne [2];
  int64_t local_28;
  int64_t local_20;
  
  local_28 = ne0;
  local_20 = ne1;
  pgVar1 = ggml_view_impl(ctx,a,2,&local_28,offset);
  pgVar1->nb[1] = nb1;
  pgVar1->nb[2] = nb1 * ne1;
  pgVar1->nb[3] = nb1 * ne1;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_view_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        size_t                nb1,
        size_t                offset) {
    const int64_t ne[2] = { ne0, ne1 };

    struct ggml_tensor * result = ggml_view_impl(ctx, a, 2, ne, offset);

    result->nb[1] = nb1;
    result->nb[2] = result->nb[1]*ne1;
    result->nb[3] = result->nb[2];

    return result;
}